

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GcodePovray.cpp
# Opt level: O0

double __thiscall vector3::GetZAngle(vector3 *this)

{
  double dVar1;
  vector3 *this_local;
  
  dVar1 = GetRotateAngle(this,this->x,this->y);
  return dVar1;
}

Assistant:

double GetZAngle()
  {
    return GetRotateAngle(x, y);
  }